

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall SFFile::TranslatePercussionPresetZone(SFFile *this,SFPreset *preset,SFBag *pzone)

{
  byte bVar1;
  byte bVar2;
  SFInst *pSVar3;
  SFBag *pSVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  SFPerc perc;
  
  for (uVar6 = (uint)(pzone->KeyRange).Lo; uVar6 <= (pzone->KeyRange).Hi; uVar6 = uVar6 + 1) {
    pSVar3 = this->Instruments;
    lVar5 = (long)pzone->Target;
    uVar7 = (ulong)pSVar3[lVar5].BagIndex;
    lVar8 = uVar7 * 0xc;
    for (; uVar7 < pSVar3[lVar5 + 1].BagIndex; uVar7 = uVar7 + 1) {
      pSVar4 = this->InstrBags;
      if ((((-1 < *(int *)((long)&pSVar4->Target + lVar8)) &&
           ((&(pSVar4->KeyRange).Lo)[lVar8] <= uVar6)) && (uVar6 <= (&(pSVar4->KeyRange).Hi)[lVar8])
          ) && ((bVar1 = (pzone->VelRange).Hi, (&(pSVar4->VelRange).Lo)[lVar8] <= bVar1 &&
                (bVar2 = (pzone->VelRange).Lo, bVar2 <= (&(pSVar4->VelRange).Hi)[lVar8])))) {
        perc.LoadOrder = preset->field_0x15 & 0x7f;
        perc.Preset = preset;
        memcpy(&perc.Generators,&DefaultGenerators,0x66);
        if ((char)pSVar3[lVar5].field_0x15 < '\0') {
          SetInstrumentGenerators
                    (this,&perc.Generators,(uint)pSVar4[pSVar3[lVar5].BagIndex].GenIndex,
                     (uint)pSVar4[(ulong)pSVar3[lVar5].BagIndex + 1].GenIndex);
        }
        SetInstrumentGenerators
                  (this,&perc.Generators,(uint)*(ushort *)((long)&pSVar4->GenIndex + lVar8),
                   (uint)*(ushort *)((long)&pSVar4[1].GenIndex + lVar8));
        AddPresetGenerators(this,&perc.Generators,(uint)pzone->GenIndex,(uint)pzone[1].GenIndex,
                            preset);
        perc.Generators.field_0.keyRange.Lo = (BYTE)preset->Program;
        perc.Generators.field_0.keyRange.Hi = (BYTE)uVar6;
        perc.Generators.velRange.Lo = (BYTE)*(undefined4 *)(&(pSVar4->VelRange).Lo + lVar8);
        if (perc.Generators.velRange.Lo < bVar2) {
          perc.Generators.velRange.Lo = bVar2;
        }
        perc.Generators.velRange.Hi = (&(pSVar4->VelRange).Hi)[lVar8];
        if (bVar1 < perc.Generators.velRange.Hi) {
          perc.Generators.velRange.Hi = bVar1;
        }
        perc.Generators.field_2 =
             *(anon_union_2_2_81bce89f_for_SFGenComposite_3 *)((long)&pSVar4->Target + lVar8);
        TArray<SFPerc,_SFPerc>::Push(&this->Percussion,&perc);
      }
      lVar8 = lVar8 + 0xc;
    }
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPresetZone(SFPreset *preset, SFBag *pzone)
{
	int key, i;

	for (key = pzone->KeyRange.Lo; key <= pzone->KeyRange.Hi; ++key)
	{
		SFInst *inst = &Instruments[pzone->Target];
		for (i = inst->BagIndex; i < (inst + 1)->BagIndex; ++i)
		{
			if (InstrBags[i].Target < 0)
			{ // This instrument zone has no sample.
				continue;
			}
			if (InstrBags[i].KeyRange.Lo > key || InstrBags[i].KeyRange.Hi < key)
			{ // This instrument zone does not contain the key we want.
				continue;
			}
			if (InstrBags[i].VelRange.Lo > pzone->VelRange.Hi ||
				InstrBags[i].VelRange.Hi < pzone->VelRange.Lo)
			{ // This instrument zone does not intersect the current velocity range.
				continue;
			}
			// An intersection! Add the composite generator for this key and velocity range.
			SFPerc perc;
			perc.LoadOrder = preset->LoadOrder;
			perc.Preset = preset;
			perc.Generators = DefaultGenerators;
			if (inst->bHasGlobalZone)
			{
				SetInstrumentGenerators(&perc.Generators, InstrBags[inst->BagIndex].GenIndex, InstrBags[inst->BagIndex + 1].GenIndex);
			}
			SetInstrumentGenerators(&perc.Generators, InstrBags[i].GenIndex, InstrBags[i + 1].GenIndex);
			AddPresetGenerators(&perc.Generators, pzone->GenIndex, (pzone + 1)->GenIndex, preset);
			perc.Generators.drumset = (BYTE)preset->Program;
			perc.Generators.key = key;
			perc.Generators.velRange.Lo = MAX(pzone->VelRange.Lo, InstrBags[i].VelRange.Lo);
			perc.Generators.velRange.Hi = MIN(pzone->VelRange.Hi, InstrBags[i].VelRange.Hi);
			perc.Generators.sampleID = InstrBags[i].Target;
			Percussion.Push(perc);
		}
	}
}